

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

ImGuiID __thiscall ImGuiWindow::GetID(ImGuiWindow *this,int n)

{
  ImGuiID id_00;
  uint *puVar1;
  long in_RDI;
  ImGuiContext *g;
  ImGuiID id;
  ImGuiID seed;
  void *in_stack_00000070;
  void *in_stack_00000078;
  ImGuiDataType in_stack_00000080;
  ImGuiID in_stack_00000084;
  undefined1 local_c [12];
  
  puVar1 = ImVector<unsigned_int>::back((ImVector<unsigned_int> *)(in_RDI + 200));
  id_00 = ImHashData(local_c,4,*puVar1);
  ImGui::KeepAliveID(id_00);
  if (GImGui->DebugHookIdInfo == id_00) {
    ImGui::DebugHookIdInfo(in_stack_00000084,in_stack_00000080,in_stack_00000078,in_stack_00000070);
  }
  return id_00;
}

Assistant:

ImGuiID ImGuiWindow::GetID(int n)
{
    ImGuiID seed = IDStack.back();
    ImGuiID id = ImHashData(&n, sizeof(n), seed);
    ImGui::KeepAliveID(id);
    ImGuiContext& g = *GImGui;
    if (g.DebugHookIdInfo == id)
        ImGui::DebugHookIdInfo(id, ImGuiDataType_S32, (void*)(intptr_t)n, NULL);
    return id;
}